

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O2

_Bool parse_alpha_component(char **begin,char *end,float *component)

{
  char *pcVar1;
  _Bool _Var2;
  float fVar3;
  float local_1c;
  
  local_1c = 0.0;
  _Var2 = plutovg_parse_number(begin,end,&local_1c);
  if (_Var2) {
    pcVar1 = *begin;
    if ((pcVar1 < end) && (*pcVar1 == '%')) {
      *begin = pcVar1 + 1;
      local_1c = local_1c / 100.0;
    }
    fVar3 = 1.0;
    if (local_1c <= 1.0) {
      fVar3 = local_1c;
    }
    *component = (float)(~-(uint)(local_1c < 0.0) & (uint)fVar3);
  }
  return _Var2;
}

Assistant:

static bool parse_alpha_component(const char** begin, const char* end, float* component)
{
    float value = 0;
    if(!plutovg_parse_number(begin, end, &value))
        return false;
    if(plutovg_skip_delim(begin, end, '%'))
        value /= 100.f;
    *component = plutovg_clamp(value, 0.f, 1.f);
    return true;
}